

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlCmpTextWriterStackEntry(void *data0,void *data1)

{
  xmlTextWriterStackEntry *p1;
  xmlTextWriterStackEntry *p0;
  void *data1_local;
  void *data0_local;
  
  if (data0 == data1) {
    data0_local._4_4_ = 0;
  }
  else if (data0 == (void *)0x0) {
    data0_local._4_4_ = -1;
  }
  else if (data1 == (void *)0x0) {
    data0_local._4_4_ = 1;
  }
  else {
    data0_local._4_4_ = xmlStrcmp(*data0,*data1);
  }
  return data0_local._4_4_;
}

Assistant:

static int
xmlCmpTextWriterStackEntry(const void *data0, const void *data1)
{
    xmlTextWriterStackEntry *p0;
    xmlTextWriterStackEntry *p1;

    if (data0 == data1)
        return 0;

    if (data0 == 0)
        return -1;

    if (data1 == 0)
        return 1;

    p0 = (xmlTextWriterStackEntry *) data0;
    p1 = (xmlTextWriterStackEntry *) data1;

    return xmlStrcmp(p0->name, p1->name);
}